

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext,xkb_context *context)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *normalizedSignature;
  char *inputContextClassName;
  QLatin1StringView *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  anon_class_24_3_e4601f37 *in_stack_ffffffffffffff80;
  ConnectionType in_stack_ffffffffffffff8c;
  QObject *in_stack_ffffffffffffff90;
  QMetaMethod *in_stack_ffffffffffffff98;
  QMetaMethod local_10;
  
  local_10.data.d = *(uint **)(in_FS_OFFSET + 0x28);
  if ((in_RDI != 0) && (in_RSI != 0)) {
    QObject::objectName();
    QLatin1String::QLatin1String
              ((QLatin1String *)in_stack_ffffffffffffff80,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    bVar1 = ::operator!=((QString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70);
    QString::~QString((QString *)0xb400cf);
    if ((bVar1 & 1) == 0) {
      if (setXkbContext(QPlatformInputContext*,xkb_context*)::setXkbContext == '\0') {
        iVar3 = __cxa_guard_acquire(&setXkbContext(QPlatformInputContext*,xkb_context*)::
                                     setXkbContext);
        if (iVar3 != 0) {
          in_stack_ffffffffffffff98 = &local_10;
          setXkbContext::setXkbContext =
               setXkbContext::anon_class_24_3_e4601f37::operator()(in_stack_ffffffffffffff80);
          __cxa_guard_release(&setXkbContext(QPlatformInputContext*,xkb_context*)::setXkbContext);
        }
      }
      bVar2 = QMetaMethod::isValid(&setXkbContext::setXkbContext);
      if (bVar2) {
        QtPrivate::Invoke::argument<xkb_context*>
                  ((char *)in_stack_ffffffffffffff80,
                   (xkb_context **)CONCAT17(bVar1,in_stack_ffffffffffffff78));
        QMetaMethod::invoke<QMetaMethodArgument>
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                   (QMetaMethodArgument *)in_stack_ffffffffffffff80);
      }
    }
  }
  if (*(uint **)(in_FS_OFFSET + 0x28) != local_10.data.d) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext, struct xkb_context *context)
{
    if (!inputContext || !context)
        return;

    const char *const inputContextClassName = "QComposeInputContext";
    const char *const normalizedSignature = "setXkbContext(xkb_context*)";

    if (inputContext->objectName() != QLatin1StringView(inputContextClassName))
        return;

    static const QMetaMethod setXkbContext = [&]() {
        int methodIndex = inputContext->metaObject()->indexOfMethod(normalizedSignature);
        QMetaMethod method = inputContext->metaObject()->method(methodIndex);
        Q_ASSERT(method.isValid());
        if (!method.isValid())
            qCWarning(lcQpaKeyMapper) << normalizedSignature << "not found on" << inputContextClassName;
        return method;
    }();

    if (!setXkbContext.isValid())
        return;

    setXkbContext.invoke(inputContext, Qt::DirectConnection, Q_ARG(struct xkb_context*, context));
}